

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void CLPIParser::parseProgramInfo
               (uint8_t *buffer,uint8_t *end,
               vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_> *programInfoMap,
               map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
               *streamInfoMap)

{
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  *__x;
  pointer *ppCVar1;
  iterator __position;
  uint uVar2;
  uint uVar3;
  mapped_type *pmVar4;
  BitStreamReader reader;
  CLPIStreamInfo streamInfo;
  ulong local_c0;
  uint local_b4;
  ulong local_b0;
  map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
  *local_a8;
  BitStreamReader local_a0;
  CLPIStreamInfo local_80;
  
  local_a0.super_BitStream.m_totalBits = 0;
  local_a0.super_BitStream.m_buffer = (uint *)0x0;
  local_a0.super_BitStream.m_initBuffer = (uint *)0x0;
  local_a0.m_curVal = 0;
  local_a0.m_bitLeft = 0;
  local_a8 = streamInfoMap;
  BitStream::setBuffer(&local_a0.super_BitStream,buffer,end);
  local_a0._24_8_ = local_a0._24_8_ & 0xffffffff;
  local_a0.m_curVal = BitStreamReader::getCurVal(&local_a0,local_a0.super_BitStream.m_buffer);
  local_a0.m_bitLeft = 0x20;
  BitStreamReader::skipBits(&local_a0,0x20);
  BitStreamReader::skipBits(&local_a0,8);
  uVar2 = BitStreamReader::getBits(&local_a0,8);
  if ((uVar2 & 0xff) != 0) {
    __x = &local_80.super_M2TSStreamInfo.m_index;
    local_b0 = (ulong)(uVar2 & 0xff);
    local_c0 = 0;
    do {
      __position._M_current =
           (programInfoMap->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (programInfoMap->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>::_M_realloc_insert<>
                  (programInfoMap,__position);
      }
      else {
        (__position._M_current)->SPN_program_sequence_start = 0;
        (__position._M_current)->program_map_PID = 0;
        (__position._M_current)->number_of_streams_in_ps = '\0';
        (__position._M_current)->field_0x7 = 0;
        ppCVar1 = &(programInfoMap->
                   super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      uVar2 = BitStreamReader::getBits(&local_a0,0x20);
      (programInfoMap->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>).
      _M_impl.super__Vector_impl_data._M_start[local_c0].SPN_program_sequence_start = uVar2;
      uVar2 = BitStreamReader::getBits(&local_a0,0x10);
      (programInfoMap->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>).
      _M_impl.super__Vector_impl_data._M_start[local_c0].program_map_PID = (uint16_t)uVar2;
      uVar2 = BitStreamReader::getBits(&local_a0,8);
      (programInfoMap->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>).
      _M_impl.super__Vector_impl_data._M_start[local_c0].number_of_streams_in_ps = (uint8_t)uVar2;
      BitStreamReader::skipBits(&local_a0,8);
      if ((programInfoMap->super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>).
          _M_impl.super__Vector_impl_data._M_start[local_c0].number_of_streams_in_ps != '\0') {
        uVar2 = 0;
        do {
          uVar3 = BitStreamReader::getBits(&local_a0,0x10);
          local_80.super_M2TSStreamInfo.streamPID = 0;
          local_80.super_M2TSStreamInfo.stream_coding_type = RESERVED;
          local_80.super_M2TSStreamInfo.video_format = '\0';
          local_80.super_M2TSStreamInfo.frame_rate_index = '\x03';
          local_80.super_M2TSStreamInfo.aspect_ratio_index = '\0';
          local_80.super_M2TSStreamInfo.audio_presentation_type = '\0';
          local_80.super_M2TSStreamInfo.sampling_frequency_index = '\0';
          local_80.super_M2TSStreamInfo.character_code = '\0';
          local_80.super_M2TSStreamInfo.language_code[0] = '\0';
          local_80.super_M2TSStreamInfo.language_code[1] = '\0';
          local_80.super_M2TSStreamInfo.language_code[2] = '\0';
          local_80.super_M2TSStreamInfo.language_code[3] = '\0';
          local_80.super_M2TSStreamInfo.isSecondary = false;
          local_80.super_M2TSStreamInfo.number_of_offset_sequences = 0;
          local_80.super_M2TSStreamInfo.width = 0;
          local_80.super_M2TSStreamInfo.height = 0;
          local_80.super_M2TSStreamInfo.HDR = 0;
          local_80.recording_year[1] = '\0';
          local_80.recording_year[2] = '\0';
          local_80.recording_number[0] = '\0';
          local_80.recording_number[1] = '\0';
          local_80.recording_number[2] = '\0';
          local_80.recording_number[3] = '\0';
          local_80.recording_number[4] = '\0';
          local_80.recording_number[5] = '\0';
          local_80.super_M2TSStreamInfo.m_index.
          super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_80.country_code[0] = '\0';
          local_80.country_code[1] = '\0';
          local_80.country_code[2] = '\0';
          local_80.copyright_holder[0] = '\0';
          local_80.copyright_holder[1] = '\0';
          local_80.copyright_holder[2] = '\0';
          local_80.copyright_holder[3] = '\0';
          local_80.recording_year[0] = '\0';
          local_80.super_M2TSStreamInfo.m_index.
          super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_80.super_M2TSStreamInfo.m_index.
          super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          CLPIStreamInfo::parseStreamCodingInfo(&local_80,&local_a0);
          local_b4 = uVar3 & 0xffff;
          pmVar4 = std::
                   map<int,_CLPIStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
                   ::operator[](local_a8,(key_type_conflict *)&local_b4);
          (pmVar4->super_M2TSStreamInfo).audio_presentation_type =
               local_80.super_M2TSStreamInfo.audio_presentation_type;
          (pmVar4->super_M2TSStreamInfo).sampling_frequency_index =
               local_80.super_M2TSStreamInfo.sampling_frequency_index;
          (pmVar4->super_M2TSStreamInfo).character_code =
               local_80.super_M2TSStreamInfo.character_code;
          (pmVar4->super_M2TSStreamInfo).language_code[0] =
               local_80.super_M2TSStreamInfo.language_code[0];
          (pmVar4->super_M2TSStreamInfo).language_code[1] =
               local_80.super_M2TSStreamInfo.language_code[1];
          (pmVar4->super_M2TSStreamInfo).language_code[2] =
               local_80.super_M2TSStreamInfo.language_code[2];
          (pmVar4->super_M2TSStreamInfo).language_code[3] =
               local_80.super_M2TSStreamInfo.language_code[3];
          (pmVar4->super_M2TSStreamInfo).isSecondary =
               (bool)local_80.super_M2TSStreamInfo.isSecondary;
          (pmVar4->super_M2TSStreamInfo).width = local_80.super_M2TSStreamInfo.width;
          (pmVar4->super_M2TSStreamInfo).height = local_80.super_M2TSStreamInfo.height;
          (pmVar4->super_M2TSStreamInfo).HDR = local_80.super_M2TSStreamInfo.HDR;
          (pmVar4->super_M2TSStreamInfo).aspect_ratio_index =
               local_80.super_M2TSStreamInfo.aspect_ratio_index;
          (pmVar4->super_M2TSStreamInfo).audio_presentation_type =
               local_80.super_M2TSStreamInfo.audio_presentation_type;
          (pmVar4->super_M2TSStreamInfo).sampling_frequency_index =
               local_80.super_M2TSStreamInfo.sampling_frequency_index;
          (pmVar4->super_M2TSStreamInfo).character_code =
               local_80.super_M2TSStreamInfo.character_code;
          (pmVar4->super_M2TSStreamInfo).streamPID = local_80.super_M2TSStreamInfo.streamPID;
          (pmVar4->super_M2TSStreamInfo).stream_coding_type =
               local_80.super_M2TSStreamInfo.stream_coding_type;
          (pmVar4->super_M2TSStreamInfo).video_format = local_80.super_M2TSStreamInfo.video_format;
          (pmVar4->super_M2TSStreamInfo).frame_rate_index =
               local_80.super_M2TSStreamInfo.frame_rate_index;
          *(undefined2 *)&(pmVar4->super_M2TSStreamInfo).field_0xa =
               local_80.super_M2TSStreamInfo._10_2_;
          (pmVar4->super_M2TSStreamInfo).number_of_offset_sequences =
               local_80.super_M2TSStreamInfo.number_of_offset_sequences;
          std::
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ::operator=(&(pmVar4->super_M2TSStreamInfo).m_index,__x);
          pmVar4->country_code[0] = local_80.country_code[0];
          pmVar4->country_code[1] = local_80.country_code[1];
          pmVar4->country_code[2] = local_80.country_code[2];
          pmVar4->copyright_holder[0] = local_80.copyright_holder[0];
          pmVar4->copyright_holder[1] = local_80.copyright_holder[1];
          pmVar4->copyright_holder[2] = local_80.copyright_holder[2];
          pmVar4->copyright_holder[3] = local_80.copyright_holder[3];
          pmVar4->recording_year[0] = local_80.recording_year[0];
          *(undefined8 *)(pmVar4->recording_year + 1) = local_80._72_8_;
          std::
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ::~vector(__x);
          uVar2 = uVar2 + 1;
        } while (uVar2 < (programInfoMap->
                         super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>).
                         _M_impl.super__Vector_impl_data._M_start[local_c0].number_of_streams_in_ps)
        ;
      }
      local_c0 = local_c0 + 1;
    } while (local_c0 != local_b0);
  }
  return;
}

Assistant:

void CLPIParser::parseProgramInfo(uint8_t* buffer, const uint8_t* end, std::vector<CLPIProgramInfo>& programInfoMap,
                                  std::map<int, CLPIStreamInfo>& streamInfoMap)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, end);
    reader.skipBits(32);  // length
    reader.skipBits(8);   // reserved_for_word_align
    const auto number_of_program_sequences = reader.getBits<uint8_t>(8);
    for (int i = 0; i < number_of_program_sequences; i++)
    {
        programInfoMap.emplace_back();
        programInfoMap[i].SPN_program_sequence_start = reader.getBits(32);
        programInfoMap[i].program_map_PID = reader.getBits<uint16_t>(16);
        programInfoMap[i].number_of_streams_in_ps = reader.getBits<uint8_t>(8);
        reader.skipBits(8);
        for (int stream_index = 0; stream_index < programInfoMap[i].number_of_streams_in_ps; stream_index++)
        {
            const auto pid = reader.getBits<uint16_t>(16);
            CLPIStreamInfo streamInfo;
            streamInfo.parseStreamCodingInfo(reader);
            streamInfoMap[pid] = streamInfo;
        }
    }
}